

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_bounding_box(rf_bounding_box box,rf_color color)

{
  float width;
  float height;
  rf_vec3 position;
  
  width = ABS(box.max.x - box.min.x);
  height = ABS(box.max.y - box.min.y);
  position.x = width * 0.5 + box.min.x;
  position.y = height * 0.5 + box.min.y;
  position.z = ABS(box.max.z - box.min.z) * 0.5 + box.min.z;
  rf_draw_cube_wires(position,width,height,ABS(box.max.z - box.min.z),color);
  return;
}

Assistant:

RF_API void rf_draw_bounding_box(rf_bounding_box box, rf_color color)
{
    rf_vec3 size;

    size.x = (float)fabs(box.max.x - box.min.x);
    size.y = (float)fabs(box.max.y - box.min.y);
    size.z = (float)fabs(box.max.z - box.min.z);

    rf_vec3 center = {box.min.x + size.x / 2.0f, box.min.y + size.y / 2.0f, box.min.z + size.z / 2.0f };

    rf_draw_cube_wires(center, size.x, size.y, size.z, color);
}